

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void FilterCompactCVars(TArray<FBaseCVar_*,_FBaseCVar_*> *cvars,DWORD filter)

{
  FBaseCVar **ppFVar1;
  FBaseCVar *local_20;
  
  ppFVar1 = &CVars;
  while( true ) {
    local_20 = *ppFVar1;
    if (local_20 == (FBaseCVar *)0x0) break;
    if ((local_20->Flags >> 0xe & 1) == 0 && (local_20->Flags & filter) != 0) {
      TArray<FBaseCVar_*,_FBaseCVar_*>::Push(cvars,&local_20);
    }
    ppFVar1 = &local_20->m_Next;
  }
  if ((ulong)cvars->Count != 0) {
    qsort(cvars->Array,(ulong)cvars->Count,8,sortcvars);
  }
  return;
}

Assistant:

void FilterCompactCVars (TArray<FBaseCVar *> &cvars, DWORD filter)
{
	// Accumulate all cvars that match the filter flags.
	for (FBaseCVar *cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
	{
		if ((cvar->Flags & filter) && !(cvar->Flags & CVAR_IGNORE))
			cvars.Push(cvar);
	}
	// Now sort them, so they're in a deterministic order and not whatever
	// order the linker put them in.
	if (cvars.Size() > 0)
	{
		qsort(&cvars[0], cvars.Size(), sizeof(FBaseCVar *), sortcvars);
	}
}